

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_long,unsigned_long(*&)(unsigned_long,unsigned_long)>
          (Memory *this,u64 offset,u64 addend,unsigned_long rhs,
          BinopFunc<unsigned_long,_unsigned_long> **func,unsigned_long *out)

{
  pointer puVar1;
  unsigned_long uVar2;
  Enum EVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  Memory *pMVar7;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  bVar4 = false;
  if (((7 < uVar5) && (offset <= uVar5)) && (addend <= uVar5)) {
    bVar4 = addend + offset + 8 <= uVar5;
  }
  uVar5 = addend + offset;
  bVar4 = (bool)((uVar5 & 7) == 0 & bVar4);
  pMVar7 = this;
  if (bVar4) {
    pMVar7 = *(Memory **)(puVar1 + uVar5);
  }
  EVar3 = Error;
  if (bVar4) {
    uVar2 = (**func)((unsigned_long)pMVar7,rhs);
    puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar6 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    bVar4 = false;
    if (((7 < uVar6) && (bVar4 = false, offset <= uVar6)) && (addend <= uVar6)) {
      bVar4 = uVar5 + 8 <= uVar6;
    }
    if (((uVar5 & 7) == 0) && (bVar4)) {
      *(unsigned_long *)(puVar1 + uVar5) = uVar2;
      *out = (unsigned_long)pMVar7;
      EVar3 = Ok;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}